

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesPrintOne(Dch_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  Aig_Obj_t *pObj_00;
  undefined8 uVar2;
  uint uVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pRepr_local;
  Dch_Cla_t *p_local;
  
  Abc_Print(1,"{ ");
  for (local_24 = 0; local_24 < p->pClassSizes[pRepr->Id]; local_24 = local_24 + 1) {
    pObj_00 = p->pId2Class[pRepr->Id][local_24];
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      uVar1 = pObj_00->Id;
      uVar2 = *(undefined8 *)&pObj_00->field_0x18;
      uVar3 = Aig_SupportSize(p->pAig,pObj_00);
      Abc_Print(1,"%d(%d,%d) ",(ulong)uVar1,(ulong)((uint)((ulong)uVar2 >> 0x20) & 0xffffff),
                (ulong)uVar3);
    }
  }
  Abc_Print(1,"}\n");
  return;
}

Assistant:

void Dch_ClassesPrintOne( Dch_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
    Abc_Print( 1, "}\n" );
}